

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferGrow(xmlParserInputBufferPtr in,int len)

{
  void *pvVar1;
  xmlInputReadCallback p_Var2;
  bool bVar3;
  int iVar4;
  xmlCharEncError xVar5;
  xmlBufPtr pxVar6;
  xmlChar *pxVar7;
  int iVar8;
  uint uVar9;
  xmlBufPtr *ppxVar10;
  size_t sizeOut;
  ulong local_38;
  
  if (in == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  if (in->error != 0) {
    return -1;
  }
  uVar9 = 4000;
  if (4000 < len) {
    uVar9 = len;
  }
  if (in->readcallback == (xmlInputReadCallback)0x0) {
    local_38._0_4_ = 0;
    goto LAB_0015d154;
  }
  if (in->encoder == (xmlCharEncodingHandlerPtr)0x0) {
    ppxVar10 = &in->buffer;
LAB_0015d0d5:
    pxVar6 = *ppxVar10;
    iVar4 = xmlBufGrow(pxVar6,(ulong)uVar9);
    iVar8 = 2;
    if (iVar4 < 0) {
      local_38._0_4_ = 0;
      goto LAB_0015d14a;
    }
    pvVar1 = in->context;
    p_Var2 = in->readcallback;
    pxVar7 = xmlBufEnd(pxVar6);
    local_38._0_4_ = (*p_Var2)(pvVar1,(char *)pxVar7,uVar9);
    if ((int)(uint)local_38 < 1) {
      in->readcallback = endOfInput;
    }
    if ((int)(uint)local_38 < 0) {
      iVar8 = 0x5dc;
      if ((uint)local_38 != 0xffffffff) {
        iVar8 = -(uint)local_38;
      }
      goto LAB_0015d14a;
    }
    iVar4 = xmlBufAddLen(pxVar6,(ulong)(uint)local_38);
    bVar3 = true;
    iVar8 = 2;
    if (iVar4 < 0) goto LAB_0015d14a;
  }
  else {
    ppxVar10 = &in->raw;
    if (in->raw != (xmlBufPtr)0x0) goto LAB_0015d0d5;
    pxVar6 = xmlBufCreate(6000);
    *ppxVar10 = pxVar6;
    if (pxVar6 != (xmlBufPtr)0x0) goto LAB_0015d0d5;
    local_38._0_4_ = 0;
    iVar8 = 2;
LAB_0015d14a:
    in->error = iVar8;
    bVar3 = false;
  }
  if (!bVar3) {
    return -1;
  }
LAB_0015d154:
  if (in->encoder != (xmlCharEncodingHandlerPtr)0x0) {
    local_38 = -(ulong)(in->readcallback != (xmlInputReadCallback)0x0) | (ulong)uVar9;
    xVar5 = xmlCharEncInput(in,&local_38,0);
    local_38._0_4_ = -(uint)(xVar5 != XML_ENC_ERR_SUCCESS) | (uint)local_38;
  }
  return (uint)local_38;
}

Assistant:

int
xmlParserInputBufferGrow(xmlParserInputBufferPtr in, int len) {
    int res = 0;

    if ((in == NULL) || (in->error))
        return(-1);

    if (len < MINLEN)
        len = MINLEN;

    /*
     * Call the read method for this I/O type.
     */
    if (in->readcallback != NULL) {
        xmlBufPtr buf;

        if (in->encoder == NULL) {
            buf = in->buffer;
        } else {
            /*
             * Some users only set 'encoder' and expect us to create
             * the raw buffer lazily.
             */
            if (in->raw == NULL) {
                in->raw = xmlBufCreate(XML_IO_BUFFER_SIZE);
                if (in->raw == NULL) {
                    in->error = XML_ERR_NO_MEMORY;
                    return(-1);
                }
            }
            buf = in->raw;
        }

        if (xmlBufGrow(buf, len) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }

	res = in->readcallback(in->context, (char *)xmlBufEnd(buf), len);
	if (res <= 0)
	    in->readcallback = endOfInput;
        if (res < 0) {
            if (res == -1)
                in->error = XML_IO_UNKNOWN;
            else
                in->error = -res;
            return(-1);
        }

        if (xmlBufAddLen(buf, res) < 0) {
            in->error = XML_ERR_NO_MEMORY;
            return(-1);
        }
    }

    /*
     * Handle encoding.
     */
    if (in->encoder != NULL) {
        size_t sizeOut;

        /*
         * Don't convert whole buffer when reading from memory.
         */
        if (in->readcallback == NULL)
            sizeOut = len;
        else
            sizeOut = SIZE_MAX;

	if (xmlCharEncInput(in, &sizeOut, /* flush */ 0) !=
            XML_ENC_ERR_SUCCESS)
	    return(-1);
        res = sizeOut;
    }
    return(res);
}